

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void changeInstallName(string *binary_file,string *old_name,string *new_name)

{
  int iVar1;
  ostream *poVar2;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string command;
  
  std::__cxx11::string::string((string *)&local_f8,"install_name_tool -change \"",&local_f9);
  std::operator+(&local_d8,&local_f8,old_name);
  std::operator+(&local_b8,&local_d8,"\" \"");
  std::operator+(&local_98,&local_b8,new_name);
  std::operator+(&local_78,&local_98,"\" \"");
  std::operator+(&local_58,&local_78,binary_file);
  std::operator+(&command,&local_58,"\"");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  iVar1 = systemp(&command);
  if (iVar1 == 0) {
    std::__cxx11::string::~string((string *)&command);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "\n\nError: An error occured while trying to fix dependencies of ");
  poVar2 = std::operator<<(poVar2,(string *)binary_file);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void changeInstallName(const std::string& binary_file, const std::string& old_name, const std::string& new_name)
{
    std::string command = std::string("install_name_tool -change \"") + old_name + "\" \"" + new_name + "\" \"" + binary_file + "\"";
    if( systemp( command ) != 0 )
    {
        std::cerr << "\n\nError: An error occured while trying to fix dependencies of " << binary_file << std::endl;
        exit(1);
    }
}